

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeDrawCmdShowMeshAndBoundingBox
               (ImGuiWindow *window,ImDrawList *draw_list,ImDrawCmd *draw_cmd,int elem_offset,
               bool show_mesh,bool show_aabb)

{
  ImDrawList *this;
  float fVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  ImVec2 IVar5;
  float fVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ImGuiContext *pIVar11;
  ImVec2 IVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImVec2 triangle [3];
  float local_e8;
  float local_d8;
  float local_c8;
  float local_b8;
  ImVec2 local_a8 [4];
  ImGuiContext *local_88;
  ImVec2 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar11 = GImGui;
  if ((char)elem_offset == '\0' && !show_mesh) {
    __assert_fail("show_mesh || show_aabb",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                  ,0x2891,
                  "static void ImGui::ShowMetricsWindow(bool *)::Funcs::NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow *, const ImDrawList *, const ImDrawCmd *, int, bool, bool)"
                 );
  }
  if ((int)(window->Pos).x < 1) {
    IVar12.x = 0.0;
    IVar12.y = 0.0;
  }
  else {
    IVar12 = window->Size;
  }
  this = &GImGui->ForegroundDrawList;
  fVar14 = (float)(draw_list->CmdBuffer).Size;
  fVar16 = (float)(draw_list->CmdBuffer).Capacity;
  fVar15 = *(float *)&(draw_list->CmdBuffer).Data;
  fVar17 = *(float *)((long)&(draw_list->CmdBuffer).Data + 4);
  uVar3 = (GImGui->ForegroundDrawList).Flags;
  (GImGui->ForegroundDrawList).Flags = uVar3 & 0xfffffffe;
  uVar13 = (uint)draw_cmd;
  if (uVar13 < (draw_list->VtxBuffer).Size + uVar13) {
    local_78 = ZEXT416((uint)fVar14);
    local_68 = ZEXT416((uint)fVar16);
    local_58 = ZEXT416((uint)fVar15);
    local_48 = ZEXT416((uint)fVar17);
    local_88 = pIVar11;
    uVar10 = (ulong)draw_cmd & 0xffffffff;
    fVar15 = 3.4028235e+38;
    fVar14 = -3.4028235e+38;
    fVar16 = -3.4028235e+38;
    fVar17 = 3.4028235e+38;
    do {
      local_a8[0].x = 0.0;
      local_a8[0].y = 0.0;
      local_a8[1].x = 0.0;
      local_a8[1].y = 0.0;
      local_a8[2].x = 0.0;
      local_a8[2].y = 0.0;
      fVar4 = (window->SizeFull).x;
      lVar7 = 0;
      do {
        uVar8 = (uint)(uVar10 + lVar7);
        if (IVar12 != (ImVec2)0x0) {
          uVar8 = (uint)*(ushort *)((long)IVar12 + (uVar10 + lVar7 & 0xffffffff) * 2);
        }
        if (((int)uVar8 < 0) || ((int)fVar4 <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.h"
                        ,0x584,
                        "const T &ImVector<ImDrawVert>::operator[](int) const [T = ImDrawVert]");
        }
        IVar5 = window->ContentSize;
        uVar9 = (ulong)uVar8;
        fVar1 = *(float *)((long)IVar5 + uVar9 * 0x14);
        fVar2 = *(float *)((long)IVar5 + 4 + uVar9 * 0x14);
        local_a8[lVar7] = *(ImVec2 *)((long)IVar5 + uVar9 * 0x14);
        fVar6 = fVar1;
        if (fVar15 <= fVar1) {
          fVar6 = fVar15;
        }
        fVar15 = fVar6;
        fVar6 = fVar2;
        if (fVar17 <= fVar2) {
          fVar6 = fVar17;
        }
        fVar17 = fVar6;
        if (fVar1 <= fVar16) {
          fVar1 = fVar16;
        }
        fVar16 = fVar1;
        if (fVar2 <= fVar14) {
          fVar2 = fVar14;
        }
        fVar14 = fVar2;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      if ((char)elem_offset != '\0') {
        ImDrawList::AddPolyline(this,local_a8,3,0xff00ffff,true,1.0);
      }
      uVar10 = uVar10 + 3;
    } while ((uint)uVar10 < (draw_list->VtxBuffer).Size + uVar13);
    local_b8 = (float)(int)fVar15;
    local_c8 = (float)(int)fVar17;
    local_d8 = (float)(int)fVar16;
    local_e8 = (float)(int)fVar14;
    pIVar11 = local_88;
    fVar14 = (float)local_78._0_4_;
    fVar16 = (float)local_68._0_4_;
    fVar17 = (float)local_48._0_4_;
    fVar15 = (float)local_58._0_4_;
  }
  if (show_mesh) {
    local_a8[0].y = (float)(int)fVar16;
    local_a8[0].x = (float)(int)fVar14;
    local_80.y = (float)(int)fVar17;
    local_80.x = (float)(int)fVar15;
    ImDrawList::AddRect(this,local_a8,&local_80,0xffff00ff,0.0,0xf,1.0);
    local_a8[0].y = local_c8;
    local_a8[0].x = local_b8;
    local_80.y = local_e8;
    local_80.x = local_d8;
    ImDrawList::AddRect(this,local_a8,&local_80,0xffffff00,0.0,0xf,1.0);
  }
  (pIVar11->ForegroundDrawList).Flags = uVar3;
  return;
}

Assistant:

static void NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow* window, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }